

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.h
# Opt level: O2

bool embree::operator<(Ref<embree::XML> *a,Ref<embree::XML> *b)

{
  bool bVar1;
  
  bVar1 = std::operator!=(&a->ptr->name,&b->ptr->name);
  if (bVar1) {
    bVar1 = std::operator<(&a->ptr->name,&b->ptr->name);
    return bVar1;
  }
  bVar1 = std::operator!=(&a->ptr->parms,&b->ptr->parms);
  if (bVar1) {
    bVar1 = std::operator<(&(a->ptr->parms)._M_t,&(b->ptr->parms)._M_t);
    return bVar1;
  }
  bVar1 = std::operator!=(&a->ptr->children,&b->ptr->children);
  if (bVar1) {
    bVar1 = std::operator<(&a->ptr->children,&b->ptr->children);
    return bVar1;
  }
  bVar1 = std::operator!=(&a->ptr->body,&b->ptr->body);
  if (bVar1) {
    bVar1 = std::operator<(&a->ptr->body,&b->ptr->body);
    return bVar1;
  }
  return false;
}

Assistant:

bool operator <( const Ref<XML>& a, const Ref<XML>& b ) {
      if (a->name     != b->name    ) return a->name     < b->name;
      if (a->parms    != b->parms   ) return a->parms    < b->parms;
      if (a->children != b->children) return a->children < b->children;
      if (a->body     != b->body    ) return a->body     < b->body;
      return false;
    }